

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswLcorr.c
# Opt level: O2

int Ssw_ManSweepResimulate(Ssw_Man_t *p)

{
  int iVar1;
  int iVar2;
  abctime aVar3;
  abctime aVar4;
  int nWords;
  int iWord;
  
  aVar3 = Abc_Clock();
  Ssw_ManSweepTransfer(p);
  Ssw_SmlSimulateOneFrame(p->pSml);
  iWord = 1;
  iVar1 = Ssw_ClassesRefineConst1(p->ppClasses,1);
  iVar2 = Ssw_ClassesRefine(p->ppClasses,1);
  Vec_PtrCleanSimInfo(p->vSimInfo,iWord,nWords);
  p->nPatterns = 0;
  p->nSimRounds = p->nSimRounds + 1;
  aVar4 = Abc_Clock();
  p->timeSimSat = p->timeSimSat + (aVar4 - aVar3);
  return (int)(0 < iVar2 || 0 < iVar1);
}

Assistant:

int Ssw_ManSweepResimulate( Ssw_Man_t * p )
{
    int RetValue1, RetValue2;
    abctime clk = Abc_Clock();
    // transfer PI simulation information from storage
    Ssw_ManSweepTransfer( p );
    // simulate internal nodes
    Ssw_SmlSimulateOneFrame( p->pSml );
    // check equivalence classes
    RetValue1 = Ssw_ClassesRefineConst1( p->ppClasses, 1 );
    RetValue2 = Ssw_ClassesRefine( p->ppClasses, 1 );
    // prepare simulation info for the next round
    Vec_PtrCleanSimInfo( p->vSimInfo, 0, 1 );
    p->nPatterns = 0;
    p->nSimRounds++;
p->timeSimSat += Abc_Clock() - clk;
    return RetValue1 > 0 || RetValue2 > 0;
}